

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O3

double __thiscall amrex::BoxArray::d_numPts(BoxArray *this)

{
  long *plVar1;
  undefined8 uVar2;
  element_type *peVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  int dir;
  long lVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  double dVar18;
  IntVect IVar19;
  Box result;
  Box bx;
  undefined8 local_88;
  uint uStack_80;
  uint auStack_7c [2];
  undefined8 uStack_74;
  Box local_68;
  double local_48;
  int local_40 [3];
  
  peVar3 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar16 = *(long *)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data;
  uVar17 = (int)((long)*(pointer *)
                        ((long)&(peVar3->m_abox).
                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data + 8) - lVar16 >> 2) * -0x49249249;
  switch((this->m_bat).m_bat_type) {
  case null:
    if (0 < (int)uVar17) {
      dVar18 = 0.0;
      lVar14 = 0;
      do {
        uVar2 = *(undefined8 *)(lVar16 + 0xc + lVar14);
        dVar18 = dVar18 + (double)((*(int *)(lVar16 + 0x14 + lVar14) - *(int *)(lVar16 + 8 + lVar14)
                                   ) + 1) *
                          (double)(((int)((ulong)uVar2 >> 0x20) -
                                   (int)((ulong)*(undefined8 *)(lVar16 + lVar14) >> 0x20)) + 1) *
                          (double)(((int)uVar2 - (int)*(undefined8 *)(lVar16 + lVar14)) + 1);
        lVar14 = lVar14 + 0x1c;
      } while ((ulong)(uVar17 & 0x7fffffff) * 0x1c != lVar14);
      return dVar18;
    }
    goto LAB_004550d4;
  case indexType:
  case indexType_coarsenRatio:
    uVar12 = *(uint *)&(this->m_bat).m_op;
    break;
  case coarsenRatio:
    uVar12 = 0;
    break;
  case bndryReg:
    if (0 < (int)uVar17) {
      uVar11 = (ulong)(uVar17 & 0x7fffffff);
      local_48 = 0.0;
      lVar16 = 0;
      do {
        BATbndryReg::operator()
                  (&local_68,&(this->m_bat).m_op.m_bndryReg,
                   (Box *)(*(long *)&(peVar3->m_abox).
                                     super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                     _M_impl.super__Vector_impl_data + lVar16));
        local_48 = local_48 +
                   (double)((local_68.bigend.vect[2] - local_68.smallend.vect[2]) + 1) *
                   (double)((local_68.bigend.vect[1] - local_68.smallend.vect[1]) + 1) *
                   (double)((local_68.bigend.vect[0] - local_68.smallend.vect[0]) + 1);
        lVar16 = lVar16 + 0x1c;
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
      return local_48;
    }
    goto LAB_004550d4;
  default:
    uVar12 = *(uint *)((long)&(this->m_bat).m_op + 4);
  }
  IVar19 = BATransformer::coarsen_ratio(&this->m_bat);
  iVar9 = IVar19.vect[2];
  local_40[0] = IVar19.vect[0];
  local_40[1] = IVar19.vect[1];
  local_40[2] = IVar19.vect[2];
  if ((int)uVar17 < 1) {
LAB_004550d4:
    dVar18 = 0.0;
  }
  else {
    lVar16 = *(long *)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data;
    iVar13 = IVar19.vect[0];
    iVar15 = IVar19.vect[1];
    dVar18 = 0.0;
    uVar11 = 0;
    do {
      plVar1 = (long *)(lVar16 + uVar11 * 0x1c);
      lVar14 = *plVar1;
      lVar4 = plVar1[1];
      plVar1 = (long *)(lVar16 + 0xc + uVar11 * 0x1c);
      lVar5 = *plVar1;
      lVar6 = plVar1[1];
      auStack_7c[1] = (uint)((ulong)lVar5 >> 0x20);
      uStack_74 = lVar6;
      uStack_80 = (uint)lVar4;
      auStack_7c[0] = (uint)((ulong)lVar4 >> 0x20);
      local_88._4_4_ = (uint)((ulong)lVar14 >> 0x20);
      uVar8 = local_88._4_4_;
      if (iVar15 == 1 && iVar13 == 1) {
        local_88 = lVar14;
        if (iVar9 != 1) goto LAB_00454d93;
      }
      else {
        local_88._0_4_ = (uint)lVar14;
        if (iVar13 != 1) {
          if (iVar13 == 4) {
            if ((int)(uint)local_88 < 0) {
              local_88._0_4_ = (int)(uint)local_88 >> 2;
            }
            else {
              local_88._0_4_ = (uint)local_88 >> 2;
            }
          }
          else if (iVar13 == 2) {
            if ((int)(uint)local_88 < 0) {
              local_88._0_4_ = (int)(uint)local_88 >> 1;
            }
            else {
              local_88._0_4_ = (uint)local_88 >> 1;
            }
          }
          else if ((int)(uint)local_88 < 0) {
            local_88._0_4_ = ~((int)~(uint)local_88 / iVar13);
          }
          else {
            local_88._0_4_ = (int)(uint)local_88 / iVar13;
          }
        }
        if (iVar15 != 1) {
          if (iVar15 == 4) {
            if (lVar14 < 0) {
              uVar8 = (int)local_88._4_4_ >> 2;
            }
            else {
              uVar8 = local_88._4_4_ >> 2;
            }
          }
          else if (iVar15 == 2) {
            if (lVar14 < 0) {
              uVar8 = (int)local_88._4_4_ >> 1;
            }
            else {
              uVar8 = local_88._4_4_ >> 1;
            }
          }
          else if (lVar14 < 0) {
            uVar8 = ~((int)~local_88._4_4_ / iVar15);
          }
          else {
            uVar8 = (int)local_88._4_4_ / iVar15;
          }
        }
LAB_00454d93:
        local_88 = CONCAT44(uVar8,(uint)local_88);
        if (iVar9 != 1) {
          if (iVar9 == 4) {
            if ((int)uStack_80 < 0) {
              uStack_80 = (int)uStack_80 >> 2;
            }
            else {
              uStack_80 = uStack_80 >> 2;
            }
          }
          else if (iVar9 == 2) {
            if ((int)uStack_80 < 0) {
              uStack_80 = (int)uStack_80 >> 1;
            }
            else {
              uStack_80 = uStack_80 >> 1;
            }
          }
          else if ((int)uStack_80 < 0) {
            uStack_80 = ~((int)~uStack_80 / iVar9);
          }
          else {
            uStack_80 = (int)uStack_80 / iVar9;
          }
        }
        uStack_74._4_4_ = (uint)((ulong)lVar6 >> 0x20);
        uStack_74._0_4_ = (uint)lVar6;
        if (uStack_74._4_4_ == 0) {
          uVar8 = auStack_7c[0];
          if (iVar13 != 1) {
            if (iVar13 == 4) {
              uVar8 = (int)auStack_7c[0] >> 2;
              if (-1 < lVar4) {
                uVar8 = auStack_7c[0] >> 2;
              }
            }
            else if (iVar13 == 2) {
              uVar8 = (int)auStack_7c[0] >> 1;
              if (-1 < lVar4) {
                uVar8 = auStack_7c[0] >> 1;
              }
            }
            else if (lVar4 < 0) {
              uVar8 = ~((int)~auStack_7c[0] / iVar13);
            }
            else {
              uVar8 = (int)auStack_7c[0] / iVar13;
            }
          }
          auStack_7c[0] = uVar8;
          uVar8 = auStack_7c[1];
          if (iVar15 != 1) {
            if (iVar15 == 4) {
              uVar8 = (int)auStack_7c[1] >> 2;
              if (-1 < lVar5) {
                uVar8 = auStack_7c[1] >> 2;
              }
            }
            else if (iVar15 == 2) {
              uVar8 = (int)auStack_7c[1] >> 1;
              if (-1 < lVar5) {
                uVar8 = auStack_7c[1] >> 1;
              }
            }
            else if (lVar5 < 0) {
              uVar8 = ~((int)~auStack_7c[1] / iVar15);
            }
            else {
              uVar8 = (int)auStack_7c[1] / iVar15;
            }
          }
          auStack_7c[1] = uVar8;
          uVar8 = (uint)uStack_74;
          if (iVar9 != 1) {
            if (iVar9 == 4) {
              uVar8 = (int)(uint)uStack_74 >> 2;
              if (-1 < (int)(uint)uStack_74) {
                uVar8 = (uint)uStack_74 >> 2;
              }
            }
            else if (iVar9 == 2) {
              uVar8 = (int)(uint)uStack_74 >> 1;
              if (-1 < (int)(uint)uStack_74) {
                uVar8 = (uint)uStack_74 >> 1;
              }
            }
            else if ((int)(uint)uStack_74 < 0) {
              uVar8 = ~((int)~(uint)uStack_74 / iVar9);
            }
            else {
              uVar8 = (int)(uint)uStack_74 / iVar9;
            }
          }
        }
        else {
          local_68.smallend.vect[0] = 0;
          local_68.smallend.vect[1] = 0;
          local_68.smallend.vect[2] = 0;
          lVar14 = 0;
          do {
            if (((uStack_74._4_4_ >> ((uint)lVar14 & 0x1f) & 1) != 0) &&
               ((int)auStack_7c[lVar14] % local_40[lVar14] != 0)) {
              local_68.smallend.vect[lVar14] = 1;
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 != 3);
          uVar8 = auStack_7c[0];
          if (iVar13 != 1) {
            if (iVar13 == 4) {
              uVar8 = (int)auStack_7c[0] >> 2;
              if (-1 < lVar4) {
                uVar8 = auStack_7c[0] >> 2;
              }
            }
            else if (iVar13 == 2) {
              uVar8 = (int)auStack_7c[0] >> 1;
              if (-1 < lVar4) {
                uVar8 = auStack_7c[0] >> 1;
              }
            }
            else if (lVar4 < 0) {
              uVar8 = ~((int)~auStack_7c[0] / iVar13);
            }
            else {
              uVar8 = (int)auStack_7c[0] / iVar13;
            }
          }
          uVar10 = auStack_7c[1];
          if (iVar15 != 1) {
            if (iVar15 == 4) {
              uVar10 = (int)auStack_7c[1] >> 2;
              if (-1 < lVar5) {
                uVar10 = auStack_7c[1] >> 2;
              }
            }
            else if (iVar15 == 2) {
              uVar10 = (int)auStack_7c[1] >> 1;
              if (-1 < lVar5) {
                uVar10 = auStack_7c[1] >> 1;
              }
            }
            else if (lVar5 < 0) {
              uVar10 = ~((int)~auStack_7c[1] / iVar15);
            }
            else {
              uVar10 = (int)auStack_7c[1] / iVar15;
            }
          }
          uVar7 = (uint)uStack_74;
          if (iVar9 != 1) {
            if (iVar9 == 4) {
              uVar7 = (int)(uint)uStack_74 >> 2;
              if (-1 < (int)(uint)uStack_74) {
                uVar7 = (uint)uStack_74 >> 2;
              }
            }
            else if (iVar9 == 2) {
              uVar7 = (int)(uint)uStack_74 >> 1;
              if (-1 < (int)(uint)uStack_74) {
                uVar7 = (uint)uStack_74 >> 1;
              }
            }
            else if ((int)(uint)uStack_74 < 0) {
              uVar7 = ~((int)~(uint)uStack_74 / iVar9);
            }
            else {
              uVar7 = (int)(uint)uStack_74 / iVar9;
            }
          }
          auStack_7c[0] = uVar8 + local_68.smallend.vect[0];
          auStack_7c[1] = uVar10 + local_68.smallend.vect[1];
          uVar8 = uVar7 + local_68.smallend.vect[2];
        }
        uStack_74 = CONCAT44(uStack_74._4_4_,uVar8);
      }
      local_68.bigend.vect[1] = auStack_7c[1];
      local_68.bigend.vect[2] = (uint)uStack_74;
      local_68.bigend.vect[0] = auStack_7c[0];
      lVar14 = 0;
      do {
        uVar10 = 1 << ((byte)lVar14 & 0x1f);
        uVar8 = (uint)lVar14;
        local_68.bigend.vect[lVar14] =
             (local_68.bigend.vect[lVar14] + (uint)((uVar12 >> (uVar8 & 0x1f) & 1) != 0)) -
             (uint)((uStack_74._4_4_ >> (uVar8 & 0x1f) & 1) != 0);
        if ((uVar12 >> (uVar8 & 0x1f) & 1) == 0) {
          uStack_74._4_4_ = ~uVar10 & uStack_74._4_4_;
        }
        else {
          uStack_74._4_4_ = uVar10 | uStack_74._4_4_;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 3);
      dVar18 = dVar18 + (double)(int)((local_68.bigend.vect[2] - uStack_80) + 1) *
                        (double)((local_68.bigend.vect[1] - (int)((ulong)local_88 >> 0x20)) + 1) *
                        (double)((local_68.bigend.vect[0] - (int)local_88) + 1);
      uVar11 = uVar11 + 1;
    } while (uVar11 != (uVar17 & 0x7fffffff));
  }
  return dVar18;
}

Assistant:

double
BoxArray::d_numPts () const noexcept
{
    double result = 0;
    const int N = size();
    auto const& bxs = this->m_ref->m_abox;
    if (m_bat.is_null()) {
#ifdef AMREX_USE_OMP
#pragma omp parallel for reduction(+:result)
#endif
        for (int i = 0; i < N; ++i)
        {
            result += bxs[i].d_numPts();
        }
    } else if (m_bat.is_simple()) {
        IndexType t = ixType();
        IntVect cr = crseRatio();
#ifdef AMREX_USE_OMP
#pragma omp parallel for reduction(+:result)
#endif
        for (int i = 0; i < N; ++i)
        {
            result += amrex::convert(amrex::coarsen(bxs[i],cr),t).d_numPts();
        }
    } else {
#ifdef AMREX_USE_OMP
#pragma omp parallel for reduction(+:result)
#endif
        for (int i = 0; i < N; ++i)
        {
            result += m_bat.m_op.m_bndryReg(bxs[i]).d_numPts();
        }
    }

    return result;
}